

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> *
dynamicgraph::signal_io_base<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cast
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,istringstream *is)

{
  byte bVar1;
  ExceptionSignal *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ErrorCodeEnum local_30 [5];
  undefined1 local_19;
  istringstream *local_18;
  istringstream *is_local;
  Matrix<double,__1,__1,_0,__1,__1> *inst;
  
  local_19 = 0;
  local_18 = is;
  is_local = (istringstream *)__return_storage_ptr__;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(__return_storage_ptr__);
  Eigen::operator>>(local_18,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             __return_storage_ptr__);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    this = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_30[0] = GENERIC;
    std::__cxx11::istringstream::str();
    std::operator+(&local_50,"failed to serialize ",&local_70);
    dynamicgraph::ExceptionSignal::ExceptionSignal(this,local_30,(string *)&local_50);
    __cxa_throw(this,&ExceptionSignal::typeinfo,ExceptionSignal::~ExceptionSignal);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static T cast(std::istringstream &is) {
    T inst;
    is >> inst;
    if (is.fail()) {
      throw ExceptionSignal(ExceptionSignal::GENERIC,
                            "failed to serialize " + is.str());
    }
    return inst;
  }